

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

bool __thiscall re2::Compiler::ByteRangeEqual(Compiler *this,int id1,int id2)

{
  int iVar1;
  int iVar2;
  
  iVar1 = Prog::Inst::lo(this->inst_ + id1);
  iVar2 = Prog::Inst::lo(this->inst_ + id2);
  if (iVar1 == iVar2) {
    iVar1 = Prog::Inst::hi(this->inst_ + id1);
    iVar2 = Prog::Inst::hi(this->inst_ + id2);
    if (iVar1 == iVar2) {
      iVar1 = Prog::Inst::foldcase(this->inst_ + id1);
      iVar2 = Prog::Inst::foldcase(this->inst_ + id2);
      return iVar1 == iVar2;
    }
  }
  return false;
}

Assistant:

bool Compiler::ByteRangeEqual(int id1, int id2) {
  return inst_[id1].lo() == inst_[id2].lo() &&
         inst_[id1].hi() == inst_[id2].hi() &&
         inst_[id1].foldcase() == inst_[id2].foldcase();
}